

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O2

void __thiscall EventLoop::execute_task_funcs(EventLoop *this)

{
  size_t i;
  ulong uVar1;
  pointer pfVar2;
  pointer pfVar3;
  long lVar4;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> functors;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> local_48;
  
  local_48.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->el_dealing_task_funcs = true;
  std::mutex::lock(&this->el_mutex);
  pfVar3 = (this->el_task_funcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pfVar2 = (this->el_task_funcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->el_task_funcs).
       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->el_task_funcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->el_task_funcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->el_task_funcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = pfVar3;
  local_48.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = pfVar2;
  pthread_mutex_unlock((pthread_mutex_t *)&this->el_mutex);
  lVar4 = 0;
  for (uVar1 = 0; uVar1 < (ulong)((long)pfVar2 - (long)pfVar3 >> 5); uVar1 = uVar1 + 1) {
    std::function<void_()>::operator()
              ((function<void_()> *)((long)&(pfVar3->super__Function_base)._M_functor + lVar4));
    lVar4 = lVar4 + 0x20;
    pfVar2 = local_48.
             super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pfVar3 = local_48.
             super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  this->el_dealing_task_funcs = false;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector(&local_48);
  return;
}

Assistant:

void EventLoop::execute_task_funcs() {
    std::vector<Task> functors;
    el_dealing_task_funcs = true;

    {
        lock_guard<mutex> lock(el_mutex);
        functors.swap(el_task_funcs);
    }

    for (size_t i = 0; i < functors.size(); ++i) functors[i]();
    el_dealing_task_funcs = false;
}